

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLText * __thiscall tinyxml2::XMLDocument::NewText(XMLDocument *this,char *str)

{
  XMLText *pXVar1;
  
  pXVar1 = CreateUnlinkedNode<tinyxml2::XMLText,112>(this,&this->_textPool);
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,str,0);
  return pXVar1;
}

Assistant:

XMLText* XMLDocument::NewText(const char* str)
{
    XMLText* text = CreateUnlinkedNode<XMLText>(_textPool);
    text->SetValue(str);
    return text;
}